

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O2

FFont * FFont::FindFont(char *name)

{
  FFont *pFVar1;
  int iVar2;
  FFont **ppFVar3;
  
  if (name != (char *)0x0) {
    ppFVar3 = &FirstFont;
    while (pFVar1 = *ppFVar3, pFVar1 != (FFont *)0x0) {
      iVar2 = strcasecmp(pFVar1->Name,name);
      if (iVar2 == 0) {
        return pFVar1;
      }
      ppFVar3 = &pFVar1->Next;
    }
  }
  return (FFont *)0x0;
}

Assistant:

FFont *FFont::FindFont (const char *name)
{
	if (name == NULL)
	{
		return NULL;
	}
	FFont *font = FirstFont;

	while (font != NULL)
	{
		if (stricmp (font->Name, name) == 0)
			break;
		font = font->Next;
	}
	return font;
}